

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O3

SmallBuffer * __thiscall
helics::NullTranslatorOperator::convertToValue
          (NullTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *param_2)

{
  SmallBuffer *in_RDI;
  
  in_RDI->bufferSize = 0;
  (in_RDI->buffer)._M_elems[0x30] = 0;
  (in_RDI->buffer)._M_elems[0x31] = 0;
  (in_RDI->buffer)._M_elems[0x32] = 0;
  (in_RDI->buffer)._M_elems[0x33] = 0;
  (in_RDI->buffer)._M_elems[0x34] = 0;
  (in_RDI->buffer)._M_elems[0x35] = 0;
  (in_RDI->buffer)._M_elems[0x36] = 0;
  (in_RDI->buffer)._M_elems[0x37] = 0;
  (in_RDI->buffer)._M_elems[0x38] = 0;
  (in_RDI->buffer)._M_elems[0x39] = 0;
  (in_RDI->buffer)._M_elems[0x3a] = 0;
  (in_RDI->buffer)._M_elems[0x3b] = 0;
  (in_RDI->buffer)._M_elems[0x3c] = 0;
  (in_RDI->buffer)._M_elems[0x3d] = 0;
  (in_RDI->buffer)._M_elems[0x3e] = 0;
  (in_RDI->buffer)._M_elems[0x3f] = 0;
  (in_RDI->buffer)._M_elems[0x20] = 0;
  (in_RDI->buffer)._M_elems[0x21] = 0;
  (in_RDI->buffer)._M_elems[0x22] = 0;
  (in_RDI->buffer)._M_elems[0x23] = 0;
  (in_RDI->buffer)._M_elems[0x24] = 0;
  (in_RDI->buffer)._M_elems[0x25] = 0;
  (in_RDI->buffer)._M_elems[0x26] = 0;
  (in_RDI->buffer)._M_elems[0x27] = 0;
  (in_RDI->buffer)._M_elems[0x28] = 0;
  (in_RDI->buffer)._M_elems[0x29] = 0;
  (in_RDI->buffer)._M_elems[0x2a] = 0;
  (in_RDI->buffer)._M_elems[0x2b] = 0;
  (in_RDI->buffer)._M_elems[0x2c] = 0;
  (in_RDI->buffer)._M_elems[0x2d] = 0;
  (in_RDI->buffer)._M_elems[0x2e] = 0;
  (in_RDI->buffer)._M_elems[0x2f] = 0;
  (in_RDI->buffer)._M_elems[0x10] = 0;
  (in_RDI->buffer)._M_elems[0x11] = 0;
  (in_RDI->buffer)._M_elems[0x12] = 0;
  (in_RDI->buffer)._M_elems[0x13] = 0;
  (in_RDI->buffer)._M_elems[0x14] = 0;
  (in_RDI->buffer)._M_elems[0x15] = 0;
  (in_RDI->buffer)._M_elems[0x16] = 0;
  (in_RDI->buffer)._M_elems[0x17] = 0;
  (in_RDI->buffer)._M_elems[0x18] = 0;
  (in_RDI->buffer)._M_elems[0x19] = 0;
  (in_RDI->buffer)._M_elems[0x1a] = 0;
  (in_RDI->buffer)._M_elems[0x1b] = 0;
  (in_RDI->buffer)._M_elems[0x1c] = 0;
  (in_RDI->buffer)._M_elems[0x1d] = 0;
  (in_RDI->buffer)._M_elems[0x1e] = 0;
  (in_RDI->buffer)._M_elems[0x1f] = 0;
  (in_RDI->buffer)._M_elems[0] = 0;
  (in_RDI->buffer)._M_elems[1] = 0;
  (in_RDI->buffer)._M_elems[2] = 0;
  (in_RDI->buffer)._M_elems[3] = 0;
  (in_RDI->buffer)._M_elems[4] = 0;
  (in_RDI->buffer)._M_elems[5] = 0;
  (in_RDI->buffer)._M_elems[6] = 0;
  (in_RDI->buffer)._M_elems[7] = 0;
  (in_RDI->buffer)._M_elems[8] = 0;
  (in_RDI->buffer)._M_elems[9] = 0;
  (in_RDI->buffer)._M_elems[10] = 0;
  (in_RDI->buffer)._M_elems[0xb] = 0;
  (in_RDI->buffer)._M_elems[0xc] = 0;
  (in_RDI->buffer)._M_elems[0xd] = 0;
  (in_RDI->buffer)._M_elems[0xe] = 0;
  (in_RDI->buffer)._M_elems[0xf] = 0;
  in_RDI->bufferCapacity = 0x40;
  in_RDI->heap = (byte *)in_RDI;
  in_RDI->nonOwning = false;
  in_RDI->locked = false;
  in_RDI->usingAllocatedBuffer = false;
  in_RDI->errorCondition = '\0';
  in_RDI->userKey = 0;
  return in_RDI;
}

Assistant:

virtual SmallBuffer convertToValue(std::unique_ptr<Message> /*message*/) override { return {}; }